

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O2

void __thiscall HighVariable::merge(HighVariable *this,HighVariable *tv2,bool isspeculative)

{
  int2 *piVar1;
  int iVar2;
  pointer ppVVar3;
  pointer ppVVar4;
  Varnode *pVVar5;
  LowlevelError *this_00;
  long lVar6;
  value_type local_40;
  vector<Varnode_*,_std::allocator<Varnode_*>_> instcopy;
  
  if (tv2 != this) {
    *(byte *)&this->highflags = (byte)this->highflags | 3;
    if (isspeculative) {
      ppVVar3 = (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVVar4 = (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      iVar2 = this->numMergeClasses;
      for (lVar6 = 0; (long)ppVVar4 - (long)ppVVar3 >> 3 != lVar6; lVar6 = lVar6 + 1) {
        pVVar5 = ppVVar3[lVar6];
        pVVar5->high = this;
        piVar1 = &pVVar5->mergegroup;
        *piVar1 = *piVar1 + (short)iVar2;
      }
      this->numMergeClasses = iVar2 + tv2->numMergeClasses;
    }
    else {
      if ((this->numMergeClasses != 1) || (tv2->numMergeClasses != 1)) {
        this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)&instcopy,
                   "Making a non-speculative merge after speculative merges have occurred",
                   (allocator *)&local_40);
        LowlevelError::LowlevelError(this_00,(string *)&instcopy);
        __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      ppVVar3 = (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVVar4 = (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (lVar6 = 0; (long)ppVVar4 - (long)ppVVar3 >> 3 != lVar6; lVar6 = lVar6 + 1) {
        ppVVar3[lVar6]->high = this;
      }
    }
    std::vector<Varnode_*,_std::allocator<Varnode_*>_>::vector(&instcopy,&this->inst);
    local_40 = (value_type)0x0;
    std::vector<Varnode_*,_std::allocator<Varnode_*>_>::resize
              (&this->inst,
               ((long)(tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) +
               ((long)(this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                      .super__Vector_impl_data._M_start >> 3),&local_40);
    std::
    __merge<__gnu_cxx::__normal_iterator<Varnode**,std::vector<Varnode*,std::allocator<Varnode*>>>,__gnu_cxx::__normal_iterator<Varnode**,std::vector<Varnode*,std::allocator<Varnode*>>>,__gnu_cxx::__normal_iterator<Varnode**,std::vector<Varnode*,std::allocator<Varnode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Varnode_const*,Varnode_const*)>>
              ((__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               instcopy.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               instcopy.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<Varnode_**,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>)
               (this->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_start,
               (_Iter_comp_iter<bool_(*)(const_Varnode_*,_const_Varnode_*)>)compareJustLoc);
    ppVVar3 = (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppVVar3) {
      (tv2->inst).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVVar3;
    }
    if (((this->highflags & 4) == 0) && ((tv2->highflags & 4) == 0)) {
      Cover::merge(&this->wholecover,&tv2->wholecover);
    }
    else {
      this->highflags = this->highflags | 4;
    }
    ~HighVariable(tv2);
    operator_delete(tv2);
    std::_Vector_base<Varnode_*,_std::allocator<Varnode_*>_>::~_Vector_base
              (&instcopy.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>);
  }
  return;
}

Assistant:

void HighVariable::merge(HighVariable *tv2,bool isspeculative)

{
  int4 i;

  if (tv2 == this) return;

//   if (isAddrTied() && tv2->isAddrTied()) {
//     if (tied_varnode()->getAddr() != tv2->tied_varnode()->getAddr())
//       throw LowlevelError("Merging different addrtieds");
//   }

  highflags |= (HighVariable::flagsdirty|HighVariable::typedirty);

  if (isspeculative) {
    for(i=0;i<tv2->inst.size();++i) {
      Varnode *vn = tv2->inst[i];
      vn->setHigh(this,vn->getMergeGroup() + numMergeClasses);
    }
    numMergeClasses += tv2->numMergeClasses;
  }
  else {
    if ((numMergeClasses!=1)||(tv2->numMergeClasses!=1))
      throw LowlevelError("Making a non-speculative merge after speculative merges have occurred");
    for(i=0;i<tv2->inst.size();++i) {
      Varnode *vn = tv2->inst[i];
      vn->setHigh(this,vn->getMergeGroup());
    }
  }
  vector<Varnode *> instcopy(inst);
  inst.resize(inst.size()+tv2->inst.size(),(Varnode *)0);
  std::merge(instcopy.begin(),instcopy.end(),tv2->inst.begin(),tv2->inst.end(),inst.begin(),compareJustLoc);
  tv2->inst.clear();

  if (((highflags&HighVariable::coverdirty)==0)&&((tv2->highflags&HighVariable::coverdirty)==0))
    wholecover.merge(tv2->wholecover);
  else
    highflags |= HighVariable::coverdirty;

  delete tv2;
}